

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation_algorithm.hpp
# Opt level: O0

void __thiscall
indigox::algorithm::ElectronOptimisationAlgorithm::~ElectronOptimisationAlgorithm
          (ElectronOptimisationAlgorithm *this)

{
  code *pcVar1;
  ElectronOptimisationAlgorithm *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~ElectronOptimisationAlgorithm() {}